

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O3

U64 getNegativeRayAttacks(U64 occupied,U64 friendly,int direction,int square)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = RayTable[square][direction];
  uVar3 = occupied & uVar2;
  if (uVar3 != 0) {
    lVar1 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar2 = uVar2 ^ *(ulong *)((long)RayTable[0] +
                              (long)direction * 8 + (ulong)(((uint)lVar1 ^ 0x3f) << 6));
  }
  return ~friendly & uVar2;
}

Assistant:

U64 getNegativeRayAttacks(U64 occupied, U64 friendly, int direction, int square) {
  U64 attacks = RayTable[square][direction];
  U64 blocker = attacks & occupied;
  if(blocker) {
    square = bitScan(blocker);
    attacks ^= RayTable[square][direction];
  }
  attacks &= ~friendly;
  return attacks;
}